

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ModuleRunnerBase
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Module *wasm,
          ExternalInterface *externalInterface,
          map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
          *linkedInstances_)

{
  bool bVar1;
  ModuleRunner *pMVar2;
  Literals local_b0;
  undefined1 local_78 [8];
  Literals arguments;
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  *linkedInstances__local;
  ExternalInterface *externalInterface_local;
  Module *wasm_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  ExpressionRunner<wasm::ModuleRunner>::ExpressionRunner
            (&this->super_ExpressionRunner<wasm::ModuleRunner>,wasm,0,0);
  (this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner =
       (_func_int **)&PTR__ModuleRunnerBase_001f7c90;
  this->wasm = wasm;
  std::
  map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
  ::map(&this->globals);
  std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::vector(&this->multiValues);
  this->callDepth = 0;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&this->functionStack);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set(&this->droppedSegments);
  std::
  unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
  ::unordered_map(&this->memorySizes);
  this->scope = (FunctionScope *)0x0;
  SmallVector<std::pair<wasm::WasmException,_wasm::Name>,_4UL>::SmallVector(&this->exceptionStack);
  this->externalInterface = externalInterface;
  std::
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::map(&this->linkedInstances,linkedInstances_);
  (*externalInterface->_vptr_ExternalInterface[3])(externalInterface,&this->globals,wasm);
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  ModuleUtils::
  iterDefinedGlobals<wasm::ModuleRunnerBase<wasm::ModuleRunner>::ModuleRunnerBase(wasm::Module&,wasm::ModuleRunnerBase<wasm::ModuleRunner>::ExternalInterface*,std::map<wasm::Name,std::shared_ptr<wasm::ModuleRunner>,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::shared_ptr<wasm::ModuleRunner>>>>)::_lambda(wasm::Global*)_1_>
            (wasm,(anon_class_8_1_8991fb9c)this);
  pMVar2 = self(this);
  (*externalInterface->_vptr_ExternalInterface[2])(externalInterface,wasm,pMVar2);
  initializeTableContents(this);
  initializeMemoryContents(this);
  bVar1 = IString::is(&(wasm->start).super_IString);
  if (bVar1) {
    Literals::Literals((Literals *)local_78);
    callFunction(&local_b0,this,(Name)(wasm->start).super_IString.str,(Literals *)local_78);
    Literals::~Literals(&local_b0);
    Literals::~Literals((Literals *)local_78);
  }
  return;
}

Assistant:

ModuleRunnerBase(
    Module& wasm,
    ExternalInterface* externalInterface,
    std::map<Name, std::shared_ptr<SubType>> linkedInstances_ = {})
    : ExpressionRunner<SubType>(&wasm), wasm(wasm),
      externalInterface(externalInterface), linkedInstances(linkedInstances_) {
    // import globals from the outside
    externalInterface->importGlobals(globals, wasm);
    // generate internal (non-imported) globals
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      globals[global->name] = self()->visit(global->init).values;
    });

    // initialize the rest of the external interface
    externalInterface->init(wasm, *self());

    initializeTableContents();
    initializeMemoryContents();

    // run start, if present
    if (wasm.start.is()) {
      Literals arguments;
      callFunction(wasm.start, arguments);
    }
  }